

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::ByteSizeLong(GeneratedCodeInfo_Annotation *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  uVar4 = 0;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar8 = 0;
  }
  else {
    sVar8 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  sVar5 = internal::WireFormatLite::Int32Size(&this->path_);
  if (sVar5 != 0) {
    uVar4 = (uint)sVar5;
    if ((int)uVar4 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    sVar8 = sVar8 + uVar6;
  }
  this->_path_cached_byte_size_ = uVar4;
  sVar8 = sVar8 + sVar5;
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 7) != 0) {
    if ((uVar4 & 1) != 0) {
      sVar2 = ((this->source_file_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      if (this->begin_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->begin_ | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
    if ((uVar4 & 4) != 0) {
      if (this->end_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar4 = this->end_ | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
  }
  this->_cached_size_ = (int)sVar8;
  return sVar8;
}

Assistant:

size_t GeneratedCodeInfo_Annotation::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.GeneratedCodeInfo.Annotation)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 7u) {
    // optional string source_file = 2;
    if (has_source_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source_file());
    }

    // optional int32 begin = 3;
    if (has_begin()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->begin());
    }

    // optional int32 end = 4;
    if (has_end()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->end());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}